

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

shared_ptr<inja::ExpressionNode> __thiscall
inja::Parser::parse_expression(Parser *this,Template *tmpl)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<inja::BlockStatementNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<inja::BlockStatementNode>_>_>_>
  *this_00;
  uint uVar1;
  size_t __n;
  _Base_ptr p_Var2;
  long lVar3;
  undefined1 auVar4 [8];
  undefined4 uVar5;
  int iVar6;
  _Base_ptr p_Var7;
  element_type *peVar8;
  long *plVar9;
  ParserError *pPVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  size_type *psVar12;
  long in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Op operation;
  char *__s2;
  undefined8 this_01;
  size_type __rlen_1;
  shared_ptr<inja::ExpressionNode> sVar13;
  SourceLocation SVar14;
  string_view name;
  shared_ptr<inja::FunctionNode> function_node;
  shared_ptr<inja::ExpressionNode> expr;
  Arguments arguments;
  OperatorStack operator_stack;
  undefined1 local_168 [8];
  undefined1 auStack_160 [32];
  size_t local_140;
  size_t local_138;
  Lexer *local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  long local_108;
  json_value local_100;
  _Any_data local_f8;
  _Base_ptr *local_e8;
  size_t *local_e0;
  string local_d8;
  Arguments local_b8;
  Parser *local_98;
  Parser *local_90;
  _Deque_base<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>
  local_88;
  
  local_b8.
  super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.
  super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_108 = in_RDX;
  std::
  _Deque_base<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>
  ::_M_initialize_map(&local_88,0);
  this_00 = &tmpl->block_storage;
  local_130 = (Lexer *)&(tmpl->root).super_AstNode.pos;
  local_e8 = &(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_f8._8_8_ = &(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header;
  local_e0 = &tmpl[1].root.super_AstNode.pos;
  local_138 = 0;
  local_140 = 0;
  local_98 = this;
  local_90 = this;
  do {
    uVar5 = *(undefined4 *)&(this_00->_M_t)._M_impl;
    switch(uVar5) {
    case 9:
      if (*(char *)&tmpl[1].root.super_AstNode._vptr_AstNode == '\0') {
        Lexer::scan((Token *)local_168,local_130);
        local_e8[2] = (_Base_ptr)auStack_160._8_8_;
        *local_e8 = (_Base_ptr)local_168;
        local_e8[1] = (_Base_ptr)auStack_160._0_8_;
        *(undefined1 *)&tmpl[1].root.super_AstNode._vptr_AstNode = 1;
      }
      __n = *(size_t *)&(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header;
      p_Var2 = (tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      switch(__n) {
      case 2:
        iVar6 = bcmp(p_Var2,"or",__n);
        if ((iVar6 == 0) || ((short)p_Var2->_M_color == 0x6e69)) {
LAB_00167eee:
          uVar5 = *(undefined4 *)&(this_00->_M_t)._M_impl;
          goto switchD_001677e9_caseD_c;
        }
        break;
      case 3:
        iVar6 = bcmp(p_Var2,"and",__n);
        if ((iVar6 == 0) || (iVar6 = bcmp(p_Var2,"not",__n), iVar6 == 0)) goto LAB_00167eee;
        break;
      case 4:
        if (p_Var2->_M_color != 0x65757274) {
          __s2 = "null";
          goto LAB_00167d11;
        }
LAB_00167d21:
        if (local_138 == 0 && local_140 == 0) {
          p_Var7 = *(_Base_ptr *)(local_f8._8_8_ + 8);
          *local_e0 = *(size_t *)local_f8._8_8_;
          local_e0[1] = (size_t)p_Var7;
          auStack_160._0_8_ =
               tmpl[1].root.nodes.
               super__Vector_base<std::shared_ptr<inja::AstNode>,_std::allocator<std::shared_ptr<inja::AstNode>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_168 = (undefined1  [8])((long)p_Var2 + (__n - auStack_160._0_8_));
          local_d8._M_dataplus._M_p = (pointer)(auStack_160._0_8_ - *(long *)(local_108 + 0x28));
          local_128._M_dataplus._M_p = (pointer)0x0;
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<inja::LiteralNode,std::allocator<inja::LiteralNode>,std::basic_string_view<char,std::char_traits<char>>const&,long>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_128._M_string_length,
                     (LiteralNode **)&local_128,(allocator<inja::LiteralNode> *)&local_100,
                     (basic_string_view<char,_std::char_traits<char>_> *)local_168,(long *)&local_d8
                    );
          ::std::
          vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
          ::emplace_back<std::shared_ptr<inja::LiteralNode>>
                    ((vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
                      *)&local_b8,(shared_ptr<inja::LiteralNode> *)&local_128);
          goto LAB_00167bbd;
        }
        goto LAB_00167fe7;
      case 5:
        __s2 = "false";
LAB_00167d11:
        iVar6 = bcmp(p_Var2,__s2,__n);
        if (iVar6 == 0) goto LAB_00167d21;
      }
      if (*(int *)local_e8 == 0x15) {
        local_168 = (undefined1  [8])((long)p_Var2 - *(long *)(local_108 + 0x28));
        local_100.object = (object_t *)0x0;
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<inja::FunctionNode,std::allocator<inja::FunctionNode>,std::basic_string_view<char,std::char_traits<char>>&,long>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_f8,
                   (FunctionNode **)&local_100.object,(allocator<inja::FunctionNode> *)&local_128,
                   (basic_string_view<char,_std::char_traits<char>_> *)local_f8._8_8_,
                   (long *)local_168);
        if (*(char *)&tmpl[1].root.super_AstNode._vptr_AstNode == '\x01') {
          (tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = local_e8[2]
          ;
          p_Var2 = local_e8[1];
          *(_Base_ptr *)&(this_00->_M_t)._M_impl = *local_e8;
          *(_Base_ptr *)&(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header = p_Var2
          ;
          *(undefined1 *)&tmpl[1].root.super_AstNode._vptr_AstNode = 0;
        }
        else {
          Lexer::scan((Token *)local_168,local_130);
          (tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)auStack_160._8_8_;
          *(undefined1 (*) [8])&(this_00->_M_t)._M_impl = local_168;
          *(undefined8 *)&(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header =
               auStack_160._0_8_;
        }
        do {
          if (*(char *)&tmpl[1].root.super_AstNode._vptr_AstNode == '\x01') {
            (tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 local_e8[2];
            p_Var2 = local_e8[1];
            *(_Base_ptr *)&(this_00->_M_t)._M_impl = *local_e8;
            *(_Base_ptr *)&(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header =
                 p_Var2;
            *(undefined1 *)&tmpl[1].root.super_AstNode._vptr_AstNode = 0;
          }
          else {
            Lexer::scan((Token *)local_168,local_130);
            (tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)auStack_160._8_8_;
            *(undefined1 (*) [8])&(this_00->_M_t)._M_impl = local_168;
            *(undefined8 *)&(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header =
                 auStack_160._0_8_;
          }
          parse_expression((Parser *)local_168,tmpl);
          auVar4 = local_168;
          if (local_168 != (undefined1  [8])0x0) {
            *(int *)(local_100.number_integer + 0x40U) =
                 *(int *)(local_100.number_integer + 0x40U) + 1;
            ::std::
            vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
            ::emplace_back<std::shared_ptr<inja::ExpressionNode>&>
                      ((vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
                        *)(local_100.number_integer + 0x48),
                       (shared_ptr<inja::ExpressionNode> *)local_168);
          }
          if ((_Base_ptr)auStack_160._0_8_ != (_Base_ptr)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_160._0_8_);
          }
          iVar6 = *(int *)&(this_00->_M_t)._M_impl;
        } while ((auVar4 != (undefined1  [8])0x0) && (iVar6 == 0x12));
        if (iVar6 != 0x16) {
          Token::describe_abi_cxx11_(&local_d8,(Token *)this_00);
          plVar9 = (long *)::std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,0x1847cc);
          local_128._M_dataplus._M_p = (pointer)*plVar9;
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p == paVar11) {
            local_128.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_128.field_2._8_8_ = plVar9[3];
            local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
          }
          else {
            local_128.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
          }
          local_128._M_string_length = plVar9[1];
          *plVar9 = (long)paVar11;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)::std::__cxx11::string::append((char *)&local_128);
          local_168 = (undefined1  [8])*plVar9;
          psVar12 = (size_type *)(plVar9 + 2);
          if (local_168 == (undefined1  [8])psVar12) {
            auStack_160._8_8_ = *psVar12;
            auStack_160._16_4_ = (undefined4)plVar9[3];
            auStack_160._20_4_ = *(undefined4 *)((long)plVar9 + 0x1c);
            local_168 = (undefined1  [8])(auStack_160 + 8);
          }
          else {
            auStack_160._8_8_ = *psVar12;
          }
          auStack_160._0_8_ = plVar9[1];
          *plVar9 = (long)psVar12;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          pPVar10 = (ParserError *)__cxa_allocate_exception(0x60);
          SVar14 = Lexer::current_position(local_130);
          ParserError::ParserError(pPVar10,(string *)local_168,SVar14);
          __cxa_throw(pPVar10,&ParserError::typeinfo,InjaError::~InjaError);
        }
        name._M_str = (char *)((local_100.object)->_M_t)._M_impl.super__Rb_tree_header._M_header.
                              _M_right;
        name._M_len = ((local_100.object)->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
        FunctionStorage::find_function
                  ((FunctionData *)local_168,
                   *(FunctionStorage **)((long)&(tmpl->content).field_2 + 8),name,
                   *(int *)(local_100.number_integer + 0x40));
        if (local_168._0_4_ == (LessEqual|Slash)) {
          ::std::operator+(&local_128,"unknown function ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &((local_100.object)->_M_t)._M_impl.super__Rb_tree_header._M_header.
                            _M_right);
          pPVar10 = (ParserError *)__cxa_allocate_exception(0x60);
          SVar14 = Lexer::current_position(local_130);
          ParserError::ParserError(pPVar10,&local_128,SVar14);
          __cxa_throw(pPVar10,&ParserError::typeinfo,InjaError::~InjaError);
        }
        *(undefined4 *)&((local_100.object)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
             local_168._0_4_;
        if (local_168._0_4_ == (LessEqual|Times)) {
          std::
          function<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_(std::vector<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>_&)>
          ::operator=((function<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_(std::vector<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>_&)>
                       *)(local_100.number_integer + 0x60),
                      (function<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_(std::vector<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>_&)>
                       *)auStack_160);
        }
        ::std::
        vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
        ::emplace_back<std::shared_ptr<inja::FunctionNode>&>
                  ((vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
                    *)&local_b8,(shared_ptr<inja::FunctionNode> *)&local_100);
        this_01 = local_f8._M_unused._0_8_;
        if ((code *)CONCAT44(auStack_160._20_4_,auStack_160._16_4_) != (code *)0x0) {
          (*(code *)CONCAT44(auStack_160._20_4_,auStack_160._16_4_))(auStack_160,auStack_160,3);
          this_01 = local_f8._M_unused._0_8_;
        }
        goto LAB_00167fdd;
      }
      local_168 = (undefined1  [8])(auStack_160 + 8);
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_168,p_Var2,(long)&p_Var2->_M_color + __n);
      local_d8._M_dataplus._M_p =
           (pointer)((long)(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header.
                           _M_parent - *(long *)(local_108 + 0x28));
      local_128._M_dataplus._M_p = (pointer)0x0;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<inja::DataNode,std::allocator<inja::DataNode>,std::__cxx11::string,long>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_128._M_string_length,
                 (DataNode **)&local_128,(allocator<inja::DataNode> *)&local_100,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168,
                 (long *)&local_d8);
      ::std::
      vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
      ::emplace_back<std::shared_ptr<inja::DataNode>>
                ((vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
                  *)&local_b8,(shared_ptr<inja::DataNode> *)&local_128);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_string_length);
      }
      if (local_168 != (undefined1  [8])(auStack_160 + 8)) {
        operator_delete((void *)local_168,(ulong)(auStack_160._8_8_ + 1));
      }
      break;
    case 10:
      if (local_138 == 0 && local_140 == 0) {
        p_Var2 = *(_Base_ptr *)(local_f8._8_8_ + 8);
        *local_e0 = *(size_t *)local_f8._8_8_;
        local_e0[1] = (size_t)p_Var2;
        auStack_160._0_8_ =
             tmpl[1].root.nodes.
             super__Vector_base<std::shared_ptr<inja::AstNode>,_std::allocator<std::shared_ptr<inja::AstNode>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_168 = (undefined1  [8])
                    ((long)(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header.
                           _M_parent +
                    (*(long *)&(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header -
                    auStack_160._0_8_));
        local_d8._M_dataplus._M_p = (pointer)(auStack_160._0_8_ - *(long *)(local_108 + 0x28));
        local_128._M_dataplus._M_p = (pointer)0x0;
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<inja::LiteralNode,std::allocator<inja::LiteralNode>,std::basic_string_view<char,std::char_traits<char>>const&,long>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_128._M_string_length,
                   (LiteralNode **)&local_128,(allocator<inja::LiteralNode> *)&local_100,
                   (basic_string_view<char,_std::char_traits<char>_> *)local_168,(long *)&local_d8);
        ::std::
        vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
        ::emplace_back<std::shared_ptr<inja::LiteralNode>>
                  ((vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
                    *)&local_b8,(shared_ptr<inja::LiteralNode> *)&local_128);
LAB_00167bbd:
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_string_length);
        }
        local_138 = 0;
        local_140 = 0;
      }
      break;
    case 0xb:
      if (local_138 == 0 && local_140 == 0) {
        p_Var2 = *(_Base_ptr *)(local_f8._8_8_ + 8);
        *local_e0 = *(size_t *)local_f8._8_8_;
        local_e0[1] = (size_t)p_Var2;
        auStack_160._0_8_ =
             tmpl[1].root.nodes.
             super__Vector_base<std::shared_ptr<inja::AstNode>,_std::allocator<std::shared_ptr<inja::AstNode>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_168 = (undefined1  [8])
                    ((long)(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header.
                           _M_parent +
                    (*(long *)&(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header -
                    auStack_160._0_8_));
        local_d8._M_dataplus._M_p = (pointer)(auStack_160._0_8_ - *(long *)(local_108 + 0x28));
        local_128._M_dataplus._M_p = (pointer)0x0;
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<inja::LiteralNode,std::allocator<inja::LiteralNode>,std::basic_string_view<char,std::char_traits<char>>const&,long>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_128._M_string_length,
                   (LiteralNode **)&local_128,(allocator<inja::LiteralNode> *)&local_100,
                   (basic_string_view<char,_std::char_traits<char>_> *)local_168,(long *)&local_d8);
        ::std::
        vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
        ::emplace_back<std::shared_ptr<inja::LiteralNode>>
                  ((vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
                    *)&local_b8,(shared_ptr<inja::LiteralNode> *)&local_128);
        goto LAB_00167bbd;
      }
      break;
    case 0xc:
    case 0xd:
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x13:
    case 0x1b:
    case 0x1c:
    case 0x1d:
    case 0x1e:
    case 0x1f:
    case 0x20:
switchD_001677e9_caseD_c:
      switch(uVar5) {
      case 9:
        lVar3 = *(long *)&(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header;
        p_Var2 = (tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        if (lVar3 == 2) {
          iVar6 = bcmp(p_Var2,"or",2);
          if (iVar6 == 0) {
            operation = Or;
          }
          else {
            operation = In;
            if ((short)p_Var2->_M_color != 0x6e69) goto LAB_0016821f;
          }
        }
        else {
          if (lVar3 != 3) {
LAB_0016821f:
            local_168 = (undefined1  [8])(auStack_160 + 8);
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_168,"unknown operator in parser.","");
            pPVar10 = (ParserError *)__cxa_allocate_exception(0x60);
            SVar14 = Lexer::current_position(local_130);
            ParserError::ParserError(pPVar10,(string *)local_168,SVar14);
            __cxa_throw(pPVar10,&ParserError::typeinfo,InjaError::~InjaError);
          }
          if (*(byte *)((long)&p_Var2->_M_color + 2) == 100 && (short)p_Var2->_M_color == 0x6e61) {
            operation = And;
          }
          else {
            iVar6 = bcmp(p_Var2,"not",3);
            operation = Not;
            if (iVar6 != 0) goto LAB_0016821f;
          }
        }
        break;
      default:
        local_168 = (undefined1  [8])(auStack_160 + 8);
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_168,"unknown operator in parser.","");
        pPVar10 = (ParserError *)__cxa_allocate_exception(0x60);
        SVar14 = Lexer::current_position(local_130);
        ParserError::ParserError(pPVar10,(string *)local_168,SVar14);
        __cxa_throw(pPVar10,&ParserError::typeinfo,InjaError::~InjaError);
      case 0xc:
        operation = Add;
        break;
      case 0xd:
        operation = Subtract;
        break;
      case 0xe:
        operation = Multiplication;
        break;
      case 0xf:
        operation = Division;
        break;
      case 0x10:
        operation = Modulo;
        break;
      case 0x11:
        operation = Power;
        break;
      case 0x13:
        operation = AtId;
        break;
      case 0x1b:
        operation = Equal;
        break;
      case 0x1c:
        operation = NotEqual;
        break;
      case 0x1d:
        operation = Greater;
        break;
      case 0x1e:
        operation = GreaterEqual;
        break;
      case 0x1f:
        operation = Less;
        break;
      case 0x20:
        operation = LessEqual;
      }
      p_Var2 = (tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      lVar3 = *(long *)(local_108 + 0x28);
      p_Var7 = (_Base_ptr)operator_new(0x90);
      p_Var7->_M_parent = (_Base_ptr)0x100000001;
      *(undefined ***)&p_Var7->_M_color = &PTR___Sp_counted_ptr_inplace_001afba8;
      FunctionNode::FunctionNode((FunctionNode *)&p_Var7->_M_left,operation,(long)p_Var2 - lVar3);
      local_168 = (undefined1  [8])&p_Var7->_M_left;
      auStack_160._0_8_ = p_Var7;
      while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
        if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
          peVar8 = (element_type *)
                   ((ForStatementNode *)
                   local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1])[5].condition.
                   super_AstNode._vptr_AstNode;
        }
        else {
          peVar8 = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].
                   super___shared_ptr<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        }
        uVar1 = *(uint *)&(((ExpressionListNode *)&peVar8->precedence)->super_AstNode)._vptr_AstNode
        ;
        if ((uVar1 <= *(uint *)((long)local_168 + 0x10)) &&
           ((uVar1 != *(uint *)((long)local_168 + 0x10) || (*(int *)((long)local_168 + 0x14) != 0)))
           ) break;
        add_operator((Parser *)tmpl,&local_b8,(OperatorStack *)&local_88);
      }
      ::std::
      deque<std::shared_ptr<inja::FunctionNode>,std::allocator<std::shared_ptr<inja::FunctionNode>>>
      ::emplace_back<std::shared_ptr<inja::FunctionNode>&>
                ((deque<std::shared_ptr<inja::FunctionNode>,std::allocator<std::shared_ptr<inja::FunctionNode>>>
                  *)&local_88,(shared_ptr<inja::FunctionNode> *)local_168);
      this_01 = auStack_160._0_8_;
      goto LAB_00167fdd;
    case 0x12:
      if (local_138 == 0 && local_140 == 0) goto switchD_001677e9_caseD_16;
      break;
    case 0x14:
      if (local_138 == 0 && local_140 == 0) {
        local_168 = (undefined1  [8])(auStack_160 + 8);
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"unexpected \':\'","")
        ;
        pPVar10 = (ParserError *)__cxa_allocate_exception(0x60);
        SVar14 = Lexer::current_position(local_130);
        ParserError::ParserError(pPVar10,(string *)local_168,SVar14);
        __cxa_throw(pPVar10,&ParserError::typeinfo,InjaError::~InjaError);
      }
      break;
    case 0x15:
      if (*(char *)&tmpl[1].root.super_AstNode._vptr_AstNode == '\x01') {
        (tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = local_e8[2];
        p_Var2 = local_e8[1];
        *(_Base_ptr *)&(this_00->_M_t)._M_impl = *local_e8;
        *(_Base_ptr *)&(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header = p_Var2;
        *(undefined1 *)&tmpl[1].root.super_AstNode._vptr_AstNode = 0;
      }
      else {
        Lexer::scan((Token *)local_168,local_130);
        (tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)auStack_160._8_8_;
        *(undefined1 (*) [8])&(this_00->_M_t)._M_impl = local_168;
        *(undefined8 *)&(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header =
             auStack_160._0_8_;
      }
      parse_expression((Parser *)&local_100,tmpl);
      if (*(int *)&(this_00->_M_t)._M_impl != 0x16) {
        Token::describe_abi_cxx11_(&local_d8,(Token *)this_00);
        plVar9 = (long *)::std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,0x1847cc);
        local_128._M_dataplus._M_p = (pointer)*plVar9;
        paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p == paVar11) {
          local_128.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
          local_128.field_2._8_8_ = plVar9[3];
          local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        }
        else {
          local_128.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        }
        local_128._M_string_length = plVar9[1];
        *plVar9 = (long)paVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)::std::__cxx11::string::append((char *)&local_128);
        local_168 = (undefined1  [8])*plVar9;
        psVar12 = (size_type *)(plVar9 + 2);
        if (local_168 == (undefined1  [8])psVar12) {
          auStack_160._8_8_ = *psVar12;
          auStack_160._16_4_ = (undefined4)plVar9[3];
          auStack_160._20_4_ = *(undefined4 *)((long)plVar9 + 0x1c);
          local_168 = (undefined1  [8])(auStack_160 + 8);
        }
        else {
          auStack_160._8_8_ = *psVar12;
        }
        auStack_160._0_8_ = plVar9[1];
        *plVar9 = (long)psVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        pPVar10 = (ParserError *)__cxa_allocate_exception(0x60);
        SVar14 = Lexer::current_position(local_130);
        ParserError::ParserError(pPVar10,(string *)local_168,SVar14);
        __cxa_throw(pPVar10,&ParserError::typeinfo,InjaError::~InjaError);
      }
      if (local_100.object == (object_t *)0x0) {
        local_168 = (undefined1  [8])(auStack_160 + 8);
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_168,"empty expression in parentheses","");
        pPVar10 = (ParserError *)__cxa_allocate_exception(0x60);
        SVar14 = Lexer::current_position(local_130);
        ParserError::ParserError(pPVar10,(string *)local_168,SVar14);
        __cxa_throw(pPVar10,&ParserError::typeinfo,InjaError::~InjaError);
      }
      ::std::
      vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
      ::emplace_back<std::shared_ptr<inja::ExpressionNode>&>
                ((vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
                  *)&local_b8,(shared_ptr<inja::ExpressionNode> *)&local_100);
      this_01 = local_f8._M_unused._0_8_;
LAB_00167fdd:
      if ((_Base_ptr)this_01 != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
      }
      break;
    default:
switchD_001677e9_caseD_16:
      while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
        add_operator((Parser *)tmpl,&local_b8,(OperatorStack *)&local_88);
      }
      local_90->config = (ParserConfig *)0x0;
      (local_90->lexer).config = (LexerConfig *)0x0;
      if ((long)local_b8.
                super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_b8.
                super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x10) {
        local_90->config =
             (ParserConfig *)
             ((local_b8.
               super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<inja::ExpressionNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_90->lexer,
                   &((local_b8.
                      super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super___shared_ptr<inja::ExpressionNode,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount);
        ::std::
        vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
        ::_M_assign_aux<std::shared_ptr<inja::ExpressionNode>const*>
                  ((vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
                    *)&local_b8,0,0);
      }
      else if (0x10 < (ulong)((long)local_b8.
                                    super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_b8.
                                   super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)) {
        local_168 = (undefined1  [8])(auStack_160 + 8);
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_168,"malformed expression","");
        pPVar10 = (ParserError *)__cxa_allocate_exception(0x60);
        SVar14 = Lexer::current_position(local_130);
        ParserError::ParserError(pPVar10,(string *)local_168,SVar14);
        __cxa_throw(pPVar10,&ParserError::typeinfo,InjaError::~InjaError);
      }
      std::
      deque<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>
      ::~deque((deque<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>
                *)&local_88);
      std::
      vector<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
      ::~vector(&local_b8);
      sVar13.super___shared_ptr<inja::ExpressionNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = extraout_RDX._M_pi;
      sVar13.super___shared_ptr<inja::ExpressionNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_98;
      return (shared_ptr<inja::ExpressionNode>)
             sVar13.super___shared_ptr<inja::ExpressionNode,_(__gnu_cxx::_Lock_policy)2>;
    case 0x17:
      if (local_138 == 0 && local_140 == 0) {
        p_Var2 = *(_Base_ptr *)(local_f8._8_8_ + 8);
        *local_e0 = *(size_t *)local_f8._8_8_;
        local_e0[1] = (size_t)p_Var2;
      }
      local_140 = local_140 + 1;
      break;
    case 0x18:
      if (local_140 == 0) {
        local_168 = (undefined1  [8])(auStack_160 + 8);
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"unexpected \']\'","")
        ;
        pPVar10 = (ParserError *)__cxa_allocate_exception(0x60);
        SVar14 = Lexer::current_position(local_130);
        ParserError::ParserError(pPVar10,(string *)local_168,SVar14);
        __cxa_throw(pPVar10,&ParserError::typeinfo,InjaError::~InjaError);
      }
      local_140 = local_140 - 1;
      if (local_138 == 0 && local_140 == 0) {
        auStack_160._0_8_ =
             tmpl[1].root.nodes.
             super__Vector_base<std::shared_ptr<inja::AstNode>,_std::allocator<std::shared_ptr<inja::AstNode>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_168 = (undefined1  [8])
                    ((long)(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header.
                           _M_parent +
                    (*(long *)&(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header -
                    auStack_160._0_8_));
        local_d8._M_dataplus._M_p = (pointer)(auStack_160._0_8_ - *(long *)(local_108 + 0x28));
        local_128._M_dataplus._M_p = (pointer)0x0;
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<inja::LiteralNode,std::allocator<inja::LiteralNode>,std::basic_string_view<char,std::char_traits<char>>const&,long>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_128._M_string_length,
                   (LiteralNode **)&local_128,(allocator<inja::LiteralNode> *)&local_100,
                   (basic_string_view<char,_std::char_traits<char>_> *)local_168,(long *)&local_d8);
        ::std::
        vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
        ::emplace_back<std::shared_ptr<inja::LiteralNode>>
                  ((vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
                    *)&local_b8,(shared_ptr<inja::LiteralNode> *)&local_128);
        goto LAB_00167bbd;
      }
      break;
    case 0x19:
      if (local_138 == 0 && local_140 == 0) {
        p_Var2 = *(_Base_ptr *)(local_f8._8_8_ + 8);
        *local_e0 = *(size_t *)local_f8._8_8_;
        local_e0[1] = (size_t)p_Var2;
      }
      local_138 = local_138 + 1;
      break;
    case 0x1a:
      if (local_138 == 0) {
        local_168 = (undefined1  [8])(auStack_160 + 8);
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"unexpected \'}\'","")
        ;
        pPVar10 = (ParserError *)__cxa_allocate_exception(0x60);
        SVar14 = Lexer::current_position(local_130);
        ParserError::ParserError(pPVar10,(string *)local_168,SVar14);
        __cxa_throw(pPVar10,&ParserError::typeinfo,InjaError::~InjaError);
      }
      local_138 = local_138 - 1;
      if (local_138 == 0 && local_140 == 0) {
        auStack_160._0_8_ =
             tmpl[1].root.nodes.
             super__Vector_base<std::shared_ptr<inja::AstNode>,_std::allocator<std::shared_ptr<inja::AstNode>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_168 = (undefined1  [8])
                    ((long)(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header.
                           _M_parent +
                    (*(long *)&(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header -
                    auStack_160._0_8_));
        local_d8._M_dataplus._M_p = (pointer)(auStack_160._0_8_ - *(long *)(local_108 + 0x28));
        local_128._M_dataplus._M_p = (pointer)0x0;
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<inja::LiteralNode,std::allocator<inja::LiteralNode>,std::basic_string_view<char,std::char_traits<char>>const&,long>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_128._M_string_length,
                   (LiteralNode **)&local_128,(allocator<inja::LiteralNode> *)&local_100,
                   (basic_string_view<char,_std::char_traits<char>_> *)local_168,(long *)&local_d8);
        ::std::
        vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
        ::emplace_back<std::shared_ptr<inja::LiteralNode>>
                  ((vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
                    *)&local_b8,(shared_ptr<inja::LiteralNode> *)&local_128);
        goto LAB_00167bbd;
      }
    }
LAB_00167fe7:
    if (*(char *)&tmpl[1].root.super_AstNode._vptr_AstNode == '\x01') {
      (tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = local_e8[2];
      p_Var2 = local_e8[1];
      *(_Base_ptr *)&(this_00->_M_t)._M_impl = *local_e8;
      *(_Base_ptr *)&(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header = p_Var2;
      *(undefined1 *)&tmpl[1].root.super_AstNode._vptr_AstNode = 0;
    }
    else {
      Lexer::scan((Token *)local_168,local_130);
      (tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)auStack_160._8_8_;
      *(undefined1 (*) [8])&(this_00->_M_t)._M_impl = local_168;
      *(undefined8 *)&(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header =
           auStack_160._0_8_;
    }
  } while( true );
}

Assistant:

std::shared_ptr<ExpressionNode> parse_expression(Template& tmpl) {
    size_t current_bracket_level {0};
    size_t current_brace_level {0};
    Arguments arguments;
    OperatorStack operator_stack;

    while (tok.kind != Token::Kind::Eof) {
      // Literals
      switch (tok.kind) {
      case Token::Kind::String: {
        if (current_brace_level == 0 && current_bracket_level == 0) {
          literal_start = tok.text;
          add_literal(arguments, tmpl.content.c_str());
        }
      } break;
      case Token::Kind::Number: {
        if (current_brace_level == 0 && current_bracket_level == 0) {
          literal_start = tok.text;
          add_literal(arguments, tmpl.content.c_str());
        }
      } break;
      case Token::Kind::LeftBracket: {
        if (current_brace_level == 0 && current_bracket_level == 0) {
          literal_start = tok.text;
        }
        current_bracket_level += 1;
      } break;
      case Token::Kind::LeftBrace: {
        if (current_brace_level == 0 && current_bracket_level == 0) {
          literal_start = tok.text;
        }
        current_brace_level += 1;
      } break;
      case Token::Kind::RightBracket: {
        if (current_bracket_level == 0) {
          throw_parser_error("unexpected ']'");
        }

        current_bracket_level -= 1;
        if (current_brace_level == 0 && current_bracket_level == 0) {
          add_literal(arguments, tmpl.content.c_str());
        }
      } break;
      case Token::Kind::RightBrace: {
        if (current_brace_level == 0) {
          throw_parser_error("unexpected '}'");
        }

        current_brace_level -= 1;
        if (current_brace_level == 0 && current_bracket_level == 0) {
          add_literal(arguments, tmpl.content.c_str());
        }
      } break;
      case Token::Kind::Id: {
        get_peek_token();

        // Data Literal
        if (tok.text == static_cast<decltype(tok.text)>("true") || tok.text == static_cast<decltype(tok.text)>("false") ||
            tok.text == static_cast<decltype(tok.text)>("null")) {
          if (current_brace_level == 0 && current_bracket_level == 0) {
            literal_start = tok.text;
            add_literal(arguments, tmpl.content.c_str());
          }

          // Operator
        } else if (tok.text == "and" || tok.text == "or" || tok.text == "in" || tok.text == "not") {
          goto parse_operator;

          // Functions
        } else if (peek_tok.kind == Token::Kind::LeftParen) {
          auto func = std::make_shared<FunctionNode>(tok.text, tok.text.data() - tmpl.content.c_str());
          get_next_token();
          do {
            get_next_token();
            auto expr = parse_expression(tmpl);
            if (!expr) {
              break;
            }
            func->number_args += 1;
            func->arguments.emplace_back(expr);
          } while (tok.kind == Token::Kind::Comma);
          if (tok.kind != Token::Kind::RightParen) {
            throw_parser_error("expected right parenthesis, got '" + tok.describe() + "'");
          }

          auto function_data = function_storage.find_function(func->name, func->number_args);
          if (function_data.operation == FunctionStorage::Operation::None) {
            throw_parser_error("unknown function " + func->name);
          }
          func->operation = function_data.operation;
          if (function_data.operation == FunctionStorage::Operation::Callback) {
            func->callback = function_data.callback;
          }
          arguments.emplace_back(func);

          // Variables
        } else {
          arguments.emplace_back(std::make_shared<DataNode>(static_cast<std::string>(tok.text), tok.text.data() - tmpl.content.c_str()));
        }

        // Operators
      } break;
      case Token::Kind::Equal:
      case Token::Kind::NotEqual:
      case Token::Kind::GreaterThan:
      case Token::Kind::GreaterEqual:
      case Token::Kind::LessThan:
      case Token::Kind::LessEqual:
      case Token::Kind::Plus:
      case Token::Kind::Minus:
      case Token::Kind::Times:
      case Token::Kind::Slash:
      case Token::Kind::Power:
      case Token::Kind::Percent:
      case Token::Kind::Dot: {

      parse_operator:
        FunctionStorage::Operation operation;
        switch (tok.kind) {
        case Token::Kind::Id: {
          if (tok.text == "and") {
            operation = FunctionStorage::Operation::And;
          } else if (tok.text == "or") {
            operation = FunctionStorage::Operation::Or;
          } else if (tok.text == "in") {
            operation = FunctionStorage::Operation::In;
          } else if (tok.text == "not") {
            operation = FunctionStorage::Operation::Not;
          } else {
            throw_parser_error("unknown operator in parser.");
          }
        } break;
        case Token::Kind::Equal: {
          operation = FunctionStorage::Operation::Equal;
        } break;
        case Token::Kind::NotEqual: {
          operation = FunctionStorage::Operation::NotEqual;
        } break;
        case Token::Kind::GreaterThan: {
          operation = FunctionStorage::Operation::Greater;
        } break;
        case Token::Kind::GreaterEqual: {
          operation = FunctionStorage::Operation::GreaterEqual;
        } break;
        case Token::Kind::LessThan: {
          operation = FunctionStorage::Operation::Less;
        } break;
        case Token::Kind::LessEqual: {
          operation = FunctionStorage::Operation::LessEqual;
        } break;
        case Token::Kind::Plus: {
          operation = FunctionStorage::Operation::Add;
        } break;
        case Token::Kind::Minus: {
          operation = FunctionStorage::Operation::Subtract;
        } break;
        case Token::Kind::Times: {
          operation = FunctionStorage::Operation::Multiplication;
        } break;
        case Token::Kind::Slash: {
          operation = FunctionStorage::Operation::Division;
        } break;
        case Token::Kind::Power: {
          operation = FunctionStorage::Operation::Power;
        } break;
        case Token::Kind::Percent: {
          operation = FunctionStorage::Operation::Modulo;
        } break;
        case Token::Kind::Dot: {
          operation = FunctionStorage::Operation::AtId;
        } break;
        default: {
          throw_parser_error("unknown operator in parser.");
        }
        }
        auto function_node = std::make_shared<FunctionNode>(operation, tok.text.data() - tmpl.content.c_str());

        while (!operator_stack.empty() &&
               ((operator_stack.top()->precedence > function_node->precedence) ||
                (operator_stack.top()->precedence == function_node->precedence && function_node->associativity == FunctionNode::Associativity::Left))) {
          add_operator(arguments, operator_stack);
        }

        operator_stack.emplace(function_node);
      } break;
      case Token::Kind::Comma: {
        if (current_brace_level == 0 && current_bracket_level == 0) {
          goto break_loop;
        }
      } break;
      case Token::Kind::Colon: {
        if (current_brace_level == 0 && current_bracket_level == 0) {
          throw_parser_error("unexpected ':'");
        }
      } break;
      case Token::Kind::LeftParen: {
        get_next_token();
        auto expr = parse_expression(tmpl);
        if (tok.kind != Token::Kind::RightParen) {
            throw_parser_error("expected right parenthesis, got '" + tok.describe() + "'");
        }
        if (!expr) {
          throw_parser_error("empty expression in parentheses");
        }
        arguments.emplace_back(expr);
      } break;
      default:
        goto break_loop;
      }

      get_next_token();
    }

  break_loop:
    while (!operator_stack.empty()) {
      add_operator(arguments, operator_stack);
    }

    std::shared_ptr<ExpressionNode> expr;
    if (arguments.size() == 1) {
      expr = arguments[0];
      arguments = {};
    } else if (arguments.size() > 1) {
      throw_parser_error("malformed expression");
    }
    return expr;
  }